

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repo_error.cpp
# Opt level: O3

string * __thiscall
pstore::repo::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  size_t sVar1;
  char *__s;
  
  if (error - 1U < 5) {
    __s = &DAT_001423a0 + *(int *)(&DAT_001423a0 + (ulong)(error - 1U) * 4);
  }
  else {
    __s = "unknown error";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            auto * result = "unknown error";
            switch (static_cast<error_code> (error)) {
            case error_code::bad_fragment_record: result = "bad fragment record"; break;
            case error_code::bad_fragment_type: result = "bad fragment type"; break;
            case error_code::bad_compilation_record: result = "bad compilation record"; break;
            case error_code::too_many_members_in_compilation:
                result = "too many members in a compilation";
                break;
            case error_code::bss_section_too_large: result = "bss section too large"; break;
            }
            return result;
        }